

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.C
# Opt level: O0

char * Utils::strncpy_s(char *dst,size_t sz,char *src,size_t len)

{
  unsigned_long *puVar1;
  char *pcVar2;
  char *rval;
  size_t local_30;
  size_t rlen;
  size_t len_local;
  char *src_local;
  size_t sz_local;
  char *dst_local;
  
  rval = (char *)(sz - 1);
  rlen = len;
  len_local = (size_t)src;
  src_local = (char *)sz;
  sz_local = (size_t)dst;
  puVar1 = std::min<unsigned_long>((unsigned_long *)&rval,&rlen);
  local_30 = *puVar1;
  pcVar2 = strncpy((char *)sz_local,(char *)len_local,local_30);
  *(undefined1 *)(sz_local + local_30) = 0;
  return pcVar2;
}

Assistant:

char * Utils::strncpy_s(char * dst, size_t sz, char const * src, size_t len)
{
    size_t rlen = std::min<size_t>(sz - 1, len);
#if defined(_WIN32)
    ::strncpy_s(dst, sz, src, rlen);
    return dst;
#else
    char * rval = ::strncpy(dst, src, rlen);
    dst[rlen] = '\0';
    return rval;
#endif
}